

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int Correct(string *modelFile)

{
  string *__return_storage_ptr__;
  size_t *__return_storage_ptr___00;
  wstring *__return_storage_ptr___01;
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  int iVar4;
  undefined1 local_1d0 [8];
  TSpellCorrector corrector;
  wstring wtext;
  wstring result;
  undefined1 local_50 [8];
  string line;
  
  NJamSpell::TSpellCorrector::TSpellCorrector((TSpellCorrector *)local_1d0);
  poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loading model");
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar1 = NJamSpell::TSpellCorrector::LoadLangModel((TSpellCorrector *)local_1d0,modelFile);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loaded");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cerr,">> ");
    local_50 = (undefined1  [8])&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    __return_storage_ptr___00 = &corrector.MaxCandiatesToCheck;
    __return_storage_ptr___01 = (wstring *)(&wtext.field_2._M_allocated_capacity + 1);
    __return_storage_ptr__ = (string *)(&result.field_2._M_allocated_capacity + 1);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,(string *)local_50);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      NJamSpell::UTF8ToWide((wstring *)__return_storage_ptr___00,(string *)local_50);
      NJamSpell::TSpellCorrector::FixFragment
                (__return_storage_ptr___01,(TSpellCorrector *)local_1d0,
                 (wstring *)__return_storage_ptr___00);
      NJamSpell::WideToUTF8(__return_storage_ptr__,__return_storage_ptr___01);
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__return_storage_ptr__);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::operator<<((ostream *)&std::cerr,">> ");
      std::__cxx11::wstring::~wstring((wstring *)__return_storage_ptr___01);
      std::__cxx11::wstring::~wstring((wstring *)__return_storage_ptr___00);
    }
    std::__cxx11::string::~string((string *)local_50);
    iVar4 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[error] failed to load model");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar4 = 0x2a;
  }
  NJamSpell::TSpellCorrector::~TSpellCorrector((TSpellCorrector *)local_1d0);
  return iVar4;
}

Assistant:

int Correct(const std::string& modelFile) {
    TSpellCorrector corrector;
    std::cerr << "[info] loading model" << std::endl;
    if (!corrector.LoadLangModel(modelFile)) {
        std::cerr << "[error] failed to load model" << std::endl;
        return 42;
    }
    std::cerr << "[info] loaded" << std::endl;
    std::cerr << ">> ";
    for (std::string line; std::getline(std::cin, line);) {
        std::wstring wtext = UTF8ToWide(line);
        std::wstring result = corrector.FixFragment(wtext);
        std::cerr << WideToUTF8(result) << "\n";
        std::cerr << ">> ";
    }
    return 0;
}